

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_reference.h
# Opt level: O2

range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_> * __thiscall
bv::internal::range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096ul>::array>>::
operator=(range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096ul>::array>> *this,
         const_range_reference<bv::internal::bitview<std::vector>_> *ref)

{
  bitview<bv::internal::bitarray_t<4096UL>::array>::copy<std::vector>
            (*(bitview<bv::internal::bitarray_t<4096UL>::array> **)this,ref->_v,ref->_begin,
             ref->_end,*(size_t *)(this + 8),*(size_t *)(this + 0x10));
  return (range_reference<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_> *)this;
}

Assistant:

range_reference const&
            operator=(const_range_reference<C1> const&ref) const
            {
                _v.copy(ref._v,
                        ref._begin, ref._end,
                            _begin,     _end);
                
                return *this;
            }